

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

string * __thiscall
args::detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array,string *delimiter)

{
  ulong *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  ulong *puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(ulong **)(this + 8);
  for (puVar2 = *(ulong **)this; puVar2 != puVar1; puVar2 = puVar2 + 4) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 (ulong)(array->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Join(const T& array, const std::string &delimiter)
        {
            std::string res;
            for (auto &element : array)
            {
                if (!res.empty())
                {
                    res += delimiter;
                }

                res += element;
            }

            return res;
        }